

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O2

void __thiscall
qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::QCircuit
          (QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this,
          string *filename,int offset)

{
  pointer *__ptr;
  pointer puVar1;
  QASMFile qasm;
  _Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false> local_2a8;
  vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  local_2a0;
  string local_288;
  QASMFile local_268;
  
  (this->super_QAdjustable).fixed_ = false;
  (this->super_QObject<std::complex<double>_>)._vptr_QObject = (_func_int **)&PTR_nbQubits_00130ae0;
  this->offset_ = offset;
  (this->gates_).
  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gates_).
  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gates_).
  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_288,(string *)filename);
  io::QASMFile::QASMFile(&local_268,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  this->nbQubits_ = local_268.nbQubits_;
  io::QASMFile::gates<qclab::QObject<std::complex<double>>>(&local_2a0,&local_268);
  for (puVar1 = local_2a0.
                super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 != local_2a0.
                super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    local_2a8._M_head_impl =
         (puVar1->_M_t).
         super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl;
    (puVar1->_M_t).
    super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl =
         (QObject<std::complex<double>_> *)0x0;
    push_back(this,(unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                    *)&local_2a8);
    if (local_2a8._M_head_impl != (QObject<std::complex<double>_> *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_QObject[0xd])();
    }
    local_2a8._M_head_impl = (QObject<std::complex<double>_> *)0x0;
  }
  std::
  vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  ::~vector(&local_2a0);
  io::QASMFile::~QASMFile(&local_268);
  return;
}

Assistant:

QCircuit( const std::string filename , const int offset = 0 )
      : offset_( offset )
      {
        // QASM file
        qclab::io::QASMFile qasm( filename ) ;
        // number of qubits
        nbQubits_ = qasm.nbQubits() ;
        // loop over gates in file
        for ( auto& gate : qasm.gates< G >() ) {
          push_back( std::move( gate ) ) ;
        }
      }